

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

broadphase_ptr __thiscall APhyBullet::BulletEngine::createDefaultBroadphase(BulletEngine *this)

{
  broadphase_ptr prVar1;
  int iVar2;
  btDbvtBroadphase *this_00;
  btGhostPairCallback *args_1;
  undefined4 extraout_var;
  broadphase_ptr local_20;
  
  this_00 = (btDbvtBroadphase *)::operator_new(0x120);
  btDbvtBroadphase::btDbvtBroadphase(this_00,(btOverlappingPairCache *)0x0);
  args_1 = (btGhostPairCallback *)::operator_new(8);
  (args_1->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback =
       (_func_int **)&PTR__btOverlappingPairCallback_001eb8b0;
  iVar2 = (*(this_00->super_btBroadphaseInterface)._vptr_btBroadphaseInterface[9])(this_00);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x78))
            ((long *)CONCAT44(extraout_var,iVar2),args_1);
  aphy::
  makeObjectWithInterface<aphy::broadphase,APhyBullet::BulletBroadphase,btDbvtBroadphase*,btGhostPairCallback*>
            ((aphy *)&local_20,this_00,args_1);
  prVar1 = local_20;
  local_20 = (broadphase_ptr)0x0;
  aphy::ref<aphy::broadphase>::~ref((ref<aphy::broadphase> *)&local_20);
  return prVar1;
}

Assistant:

broadphase_ptr BulletEngine::createDefaultBroadphase()
{
    auto handle = new btDbvtBroadphase();
    auto ghostPairCallback = new btGhostPairCallback();
    handle->getOverlappingPairCache()->setInternalGhostPairCallback(ghostPairCallback);
    return makeObject<BulletBroadphase> (handle, ghostPairCallback).disown();
}